

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O0

void __thiscall
Assimp::MD5::MD5AnimParser::MD5AnimParser(MD5AnimParser *this,SectionList *mSections)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Logger *pLVar5;
  reference pSVar6;
  long lVar7;
  reference pvVar8;
  char *pcVar9;
  float local_53c;
  uint num;
  float f;
  char *sz_2;
  Element *elem_2;
  const_iterator __end5;
  const_iterator __begin5;
  ElementList *__range5;
  FrameDesc *desc_2;
  pointer pfStack_500;
  pointer local_4f8;
  pointer pfStack_4f0;
  reference local_4e0;
  BaseFrameDesc *desc_1;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  char *local_4c0;
  char *sz_1;
  Element *elem_1;
  const_iterator __end4;
  const_iterator __begin4;
  ElementList *__range4;
  char *szEnd;
  char *szStart;
  char *sz;
  AnimBoneDesc *desc;
  reference local_68;
  Element *elem;
  const_iterator __end3;
  const_iterator __begin3;
  ElementList *__range3;
  __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
  local_40;
  const_iterator iterEnd;
  __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
  local_30;
  const_iterator iter;
  SectionList *mSections_local;
  MD5AnimParser *this_local;
  
  std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::vector
            (&this->mAnimatedBones);
  std::vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>::vector
            (&this->mBaseFrames);
  std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::vector
            (&this->mFrames);
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"MD5AnimParser begin");
  this->fFrameRate = 24.0;
  this->mNumAnimatedComponents = 0xffffffff;
  iterEnd._M_current =
       (Section *)
       std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::begin(mSections);
  __gnu_cxx::
  __normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
  ::__normal_iterator<Assimp::MD5::Section*>
            ((__normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
              *)&local_30,
             (__normal_iterator<Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
              *)&iterEnd);
  __range3 = (ElementList *)
             std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::end
                       (mSections);
  __gnu_cxx::
  __normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
  ::__normal_iterator<Assimp::MD5::Section*>
            ((__normal_iterator<Assimp::MD5::Section_const*,std::vector<Assimp::MD5::Section,std::allocator<Assimp::MD5::Section>>>
              *)&local_40,
             (__normal_iterator<Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
              *)&__range3);
  while (bVar2 = __gnu_cxx::operator!=(&local_30,&local_40), bVar2) {
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
             ::operator*(&local_30);
    bVar2 = std::operator==(&pSVar6->mName,"hierarchy");
    if (bVar2) {
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
               ::operator*(&local_30);
      __end3 = std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::begin
                         (&pSVar6->mElements);
      elem = (Element *)
             std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::end
                       (&pSVar6->mElements);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                                         *)&elem), bVar2) {
        local_68 = __gnu_cxx::
                   __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                   ::operator*(&__end3);
        memset((AnimBoneDesc *)&desc,0,0x410);
        AnimBoneDesc::AnimBoneDesc((AnimBoneDesc *)&desc);
        std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
        push_back(&this->mAnimatedBones,(AnimBoneDesc *)&desc);
        sz = (char *)std::
                     vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
                     back(&this->mAnimatedBones);
        for (szStart = local_68->szStart; *szStart != '\"'; szStart = szStart + 1) {
        }
        pcVar9 = szStart + 1;
        for (szStart = pcVar9; *szStart != '\"'; szStart = szStart + 1) {
        }
        __range4._0_4_ = (int)szStart;
        szEnd._0_4_ = (int)pcVar9;
        (((reference)sz)->super_BaseJointDescription).mName.length = (int)__range4 - (int)szEnd;
        szStart = szStart + 1;
        memcpy((((reference)sz)->super_BaseJointDescription).mName.data,pcVar9,
               (ulong)(((reference)sz)->super_BaseJointDescription).mName.length);
        sz[(ulong)*(uint *)sz + 4] = '\0';
        bVar2 = SkipSpaces<char>(&szStart);
        if (!bVar2) {
          MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
        }
        iVar3 = strtol10(szStart,&szStart);
        *(int *)(sz + 0x404) = iVar3;
        bVar2 = SkipSpaces<char>(&szStart);
        if (!bVar2) {
          MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
        }
        uVar4 = strtoul10(szStart,&szStart);
        *(uint *)(sz + 0x408) = uVar4;
        if (0x3f < uVar4) {
          MD5Parser::ReportWarning
                    ("Invalid flag combination in hierarchy section",local_68->iLineNumber);
        }
        bVar2 = SkipSpaces<char>(&szStart);
        if (!bVar2) {
          MD5Parser::ReportWarning("Unexpected end of line",local_68->iLineNumber);
        }
        uVar4 = strtoul10(szStart,&szStart);
        *(uint *)(sz + 0x40c) = uVar4;
        __gnu_cxx::
        __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
               ::operator*(&local_30);
      bVar2 = std::operator==(&pSVar6->mName,"baseframe");
      if (bVar2) {
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                 ::operator*(&local_30);
        __end4 = std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::begin
                           (&pSVar6->mElements);
        elem_1 = (Element *)
                 std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::end
                           (&pSVar6->mElements);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                                           *)&elem_1), bVar2) {
          sz_1 = (char *)__gnu_cxx::
                         __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                         ::operator*(&__end4);
          local_4c0 = ((reference)sz_1)->szStart;
          desc_1 = (BaseFrameDesc *)0x0;
          uStack_4d0._0_4_ = 0.0;
          uStack_4d0._4_4_ = 0.0;
          local_4c8._0_4_ = 0.0;
          local_4c8._4_4_ = 0.0;
          BaseFrameDesc::BaseFrameDesc((BaseFrameDesc *)&desc_1);
          std::vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>::
          push_back(&this->mBaseFrames,(BaseFrameDesc *)&desc_1);
          local_4e0 = std::
                      vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                      ::back(&this->mBaseFrames);
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          pcVar9 = local_4c0 + 1;
          cVar1 = *local_4c0;
          local_4c0 = pcVar9;
          if (cVar1 != '(') {
            MD5Parser::ReportWarning("Unexpected token: ( was expected",*(uint *)(sz_1 + 8));
          }
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          local_4c0 = fast_atoreal_move<float>(local_4c0,(float *)local_4e0,true);
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          local_4c0 = fast_atoreal_move<float>(local_4c0,&(local_4e0->vPositionXYZ).y,true);
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          local_4c0 = fast_atoreal_move<float>(local_4c0,&(local_4e0->vPositionXYZ).z,true);
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          pcVar9 = local_4c0 + 1;
          cVar1 = *local_4c0;
          local_4c0 = pcVar9;
          if (cVar1 != ')') {
            MD5Parser::ReportWarning("Unexpected token: ) was expected",*(uint *)(sz_1 + 8));
          }
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          pcVar9 = local_4c0 + 1;
          cVar1 = *local_4c0;
          local_4c0 = pcVar9;
          if (cVar1 != '(') {
            MD5Parser::ReportWarning("Unexpected token: ( was expected",*(uint *)(sz_1 + 8));
          }
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          local_4c0 = fast_atoreal_move<float>(local_4c0,&(local_4e0->vRotationQuat).x,true);
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          local_4c0 = fast_atoreal_move<float>(local_4c0,&(local_4e0->vRotationQuat).y,true);
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          local_4c0 = fast_atoreal_move<float>(local_4c0,&(local_4e0->vRotationQuat).z,true);
          bVar2 = SkipSpaces<char>(&local_4c0);
          if (!bVar2) {
            MD5Parser::ReportWarning("Unexpected end of line",*(uint *)(sz_1 + 8));
          }
          pcVar9 = local_4c0 + 1;
          cVar1 = *local_4c0;
          local_4c0 = pcVar9;
          if (cVar1 != ')') {
            MD5Parser::ReportWarning("Unexpected token: ) was expected",*(uint *)(sz_1 + 8));
          }
          __gnu_cxx::
          __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
          ::operator++(&__end4);
        }
      }
      else {
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                 ::operator*(&local_30);
        bVar2 = std::operator==(&pSVar6->mName,"frame");
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
          ::operator*(&local_30);
          lVar7 = std::__cxx11::string::length();
          if (lVar7 == 0) {
            pSVar6 = __gnu_cxx::
                     __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                     ::operator*(&local_30);
            MD5Parser::ReportWarning("A frame section must have a frame index",pSVar6->iLineNumber);
          }
          else {
            local_4f8 = (pointer)0x0;
            pfStack_4f0 = (pointer)0x0;
            desc_2 = (FrameDesc *)0x0;
            pfStack_500 = (pointer)0x0;
            FrameDesc::FrameDesc((FrameDesc *)&desc_2);
            std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::push_back
                      (&this->mFrames,(FrameDesc *)&desc_2);
            FrameDesc::~FrameDesc((FrameDesc *)&desc_2);
            pvVar8 = std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::
                     back(&this->mFrames);
            __gnu_cxx::
            __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
            ::operator*(&local_30);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            uVar4 = strtoul10(pcVar9,(char **)0x0);
            pvVar8->iIndex = uVar4;
            if (this->mNumAnimatedComponents != 0xffffffff) {
              std::vector<float,_std::allocator<float>_>::reserve
                        (&pvVar8->mValues,(ulong)this->mNumAnimatedComponents);
            }
            pSVar6 = __gnu_cxx::
                     __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                     ::operator*(&local_30);
            __end5 = std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::begin
                               (&pSVar6->mElements);
            elem_2 = (Element *)
                     std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>::end
                               (&pSVar6->mElements);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end5,(__normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                                               *)&elem_2), bVar2) {
              sz_2 = (char *)__gnu_cxx::
                             __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
                             ::operator*(&__end5);
              _num = ((reference)sz_2)->szStart;
              while (bVar2 = SkipSpacesAndLineEnd<char>((char **)&num), bVar2) {
                _num = fast_atoreal_move<float>(_num,&local_53c,true);
                std::vector<float,_std::allocator<float>_>::push_back(&pvVar8->mValues,&local_53c);
              }
              __gnu_cxx::
              __normal_iterator<const_Assimp::MD5::Element_*,_std::vector<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>_>
              ::operator++(&__end5);
            }
          }
        }
        else {
          pSVar6 = __gnu_cxx::
                   __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                   ::operator*(&local_30);
          bVar2 = std::operator==(&pSVar6->mName,"numFrames");
          if (bVar2) {
            __gnu_cxx::
            __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
            ::operator*(&local_30);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            uVar4 = strtoul10(pcVar9,(char **)0x0);
            std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::reserve
                      (&this->mFrames,(ulong)uVar4);
          }
          else {
            pSVar6 = __gnu_cxx::
                     __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                     ::operator*(&local_30);
            bVar2 = std::operator==(&pSVar6->mName,"numJoints");
            if (bVar2) {
              __gnu_cxx::
              __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
              ::operator*(&local_30);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              uVar4 = strtoul10(pcVar9,(char **)0x0);
              std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
              reserve(&this->mAnimatedBones,(ulong)uVar4);
              if (this->mNumAnimatedComponents == 0xffffffff) {
                this->mNumAnimatedComponents = uVar4 * 6;
              }
            }
            else {
              pSVar6 = __gnu_cxx::
                       __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                       ::operator*(&local_30);
              bVar2 = std::operator==(&pSVar6->mName,"numAnimatedComponents");
              if (bVar2) {
                __gnu_cxx::
                __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                ::operator*(&local_30);
                pcVar9 = (char *)std::__cxx11::string::c_str();
                uVar4 = strtoul10(pcVar9,(char **)0x0);
                std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
                reserve(&this->mAnimatedBones,(ulong)uVar4);
              }
              else {
                pSVar6 = __gnu_cxx::
                         __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                         ::operator*(&local_30);
                bVar2 = std::operator==(&pSVar6->mName,"frameRate");
                if (bVar2) {
                  __gnu_cxx::
                  __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
                  ::operator*(&local_30);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  fast_atoreal_move<float>(pcVar9,&this->fFrameRate,true);
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::MD5::Section_*,_std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>_>
    ::operator++(&local_30);
  }
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"MD5AnimParser end");
  return;
}

Assistant:

MD5AnimParser::MD5AnimParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5AnimParser begin");

    fFrameRate = 24.0f;
    mNumAnimatedComponents = UINT_MAX;
    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "hierarchy")   {
            // "sheath" 0 63 6
            for (const auto & elem : (*iter).mElements) {
                mAnimatedBones.push_back ( AnimBoneDesc () );
                AnimBoneDesc& desc = mAnimatedBones.back();

                const char* sz = elem.szStart;
                AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mName);
                AI_MD5_SKIP_SPACES();

                // parent index - negative values are allowed (at least -1)
                desc.mParentIndex = ::strtol10(sz,&sz);

                // flags (highest is 2^6-1)
                AI_MD5_SKIP_SPACES();
                if(63 < (desc.iFlags = ::strtoul10(sz,&sz))){
                    MD5Parser::ReportWarning("Invalid flag combination in hierarchy section",elem.iLineNumber);
                }
                AI_MD5_SKIP_SPACES();

                // index of the first animation keyframe component for this joint
                desc.iFirstKeyIndex = ::strtoul10(sz,&sz);
            }
        }
        else if((*iter).mName == "baseframe")   {
            // ( -0.000000 0.016430 -0.006044 ) ( 0.707107 0.000242 0.707107 )
            for (const auto & elem : (*iter).mElements) {
                const char* sz = elem.szStart;

                mBaseFrames.push_back ( BaseFrameDesc () );
                BaseFrameDesc& desc = mBaseFrames.back();

                AI_MD5_READ_TRIPLE(desc.vPositionXYZ);
                AI_MD5_READ_TRIPLE(desc.vRotationQuat);
            }
        }
        else if((*iter).mName ==  "frame")  {
            if (!(*iter).mGlobalValue.length()) {
                MD5Parser::ReportWarning("A frame section must have a frame index",(*iter).iLineNumber);
                continue;
            }

            mFrames.push_back ( FrameDesc () );
            FrameDesc& desc = mFrames.back();
            desc.iIndex = strtoul10((*iter).mGlobalValue.c_str());

            // we do already know how much storage we will presumably need
            if (UINT_MAX != mNumAnimatedComponents) {
                desc.mValues.reserve(mNumAnimatedComponents);
            }

            // now read all elements (continuous list of floats)
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;
                while (SkipSpacesAndLineEnd(&sz))   {
                    float f;sz = fast_atoreal_move<float>(sz,f);
                    desc.mValues.push_back(f);
                }
            }
        }
        else if((*iter).mName == "numFrames")   {
            mFrames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if((*iter).mName == "numJoints")   {
            const unsigned int num = strtoul10((*iter).mGlobalValue.c_str());
            mAnimatedBones.reserve(num);

            // try to guess the number of animated components if that element is not given
            if (UINT_MAX  == mNumAnimatedComponents) {
                mNumAnimatedComponents = num * 6;
            }
        }
        else if((*iter).mName == "numAnimatedComponents")   {
            mAnimatedBones.reserve( strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if((*iter).mName == "frameRate")   {
            fast_atoreal_move<float>((*iter).mGlobalValue.c_str(),fFrameRate);
        }
    }
    ASSIMP_LOG_DEBUG("MD5AnimParser end");
}